

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepLoop *L)

{
  int loop_index;
  uint uVar1;
  ON_BrepLoop *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  TYPE TVar7;
  ON_BrepLoop *pOVar8;
  ON_BrepFace *pOVar9;
  ON_BrepTrim *pOVar10;
  int *piVar11;
  ON_BrepTrim *pOVar12;
  char *sFormat;
  int iVar13;
  TYPE TVar14;
  int *piVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int *x;
  ulong uVar20;
  ON_SimpleArray<int> *pOVar21;
  long lVar22;
  int lti1;
  int lti0;
  ON_BrepFace *local_60;
  ON_BrepLoop *local_58;
  ON_BrepTrim *local_50;
  ON_BrepTrim *local_48;
  ulong local_40;
  undefined8 local_38;
  
  loop_index = L->m_loop_index;
  bVar2 = true;
  uVar16 = 0;
  while (bVar2) {
    pOVar8 = Loop(this,loop_index);
    bVar2 = FoundSlitPair(pOVar8,&lti0,&lti1);
    iVar6 = lti0;
    uVar5 = lti1;
    if (!bVar2) break;
    local_38 = uVar16;
    pOVar8 = Loop(this,loop_index);
    iVar3 = ON_BrepLoop::TrimCount(pOVar8);
    if (iVar6 < 0 || iVar3 <= iVar6) {
      iVar6 = 0xa83;
      sFormat = "lti0>=0 && lti0<trim_count is false";
LAB_0043d065:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
                 ,iVar6,"",sFormat);
      bVar2 = false;
    }
    else {
      if ((int)uVar5 < 0 || iVar3 <= (int)uVar5) {
        iVar6 = 0xa84;
        sFormat = "lti1>=0 && lti1<trim_count is false";
        goto LAB_0043d065;
      }
      if (iVar6 - uVar5 == 0) {
        iVar6 = 0xa85;
        sFormat = "lti0!=lti1 is false";
        goto LAB_0043d065;
      }
      pOVar9 = ON_BrepLoop::Face(pOVar8);
      bVar2 = false;
      if (((-1 < loop_index) && (pOVar9 != (ON_BrepFace *)0x0)) &&
         (loop_index <
          (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count)) {
        iVar13 = (int)((iVar6 - uVar5) + iVar3) % iVar3;
        if ((iVar13 == 1) || (iVar13 == iVar3 + -1)) {
          pOVar10 = ON_BrepLoop::Trim(pOVar8,iVar6);
          uVar4 = pOVar10->m_trim_index;
          pOVar10 = ON_BrepLoop::Trim(pOVar8,uVar5);
          uVar5 = pOVar10->m_trim_index;
          uVar18 = PrevTrim(this,uVar4);
          uVar17 = uVar5;
          if (uVar18 == uVar5) {
            uVar18 = PrevTrim(this,uVar5);
            uVar17 = uVar4;
          }
          uVar17 = NextTrim(this,uVar17);
          if ((int)uVar4 < 0) goto LAB_0043d4bf;
          uVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                  m_count;
          bVar2 = false;
          if ((((int)uVar4 <= (int)uVar1) && (-1 < (int)uVar5)) && (uVar5 <= uVar1)) {
            pOVar10 = Trim(this,uVar4);
            DeleteTrim(this,pOVar10,true);
            pOVar10 = Trim(this,uVar5);
            DeleteTrim(this,pOVar10,true);
            bVar2 = true;
            if ((uVar4 != uVar18 && uVar5 != uVar18) && -1 < (int)(uVar17 | uVar18)) {
              uVar5 = NextTrim(this,uVar18);
              if (uVar5 == uVar17) {
                pOVar10 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a;
                MatchTrimEnds(this,pOVar10 + (int)uVar18,pOVar10 + (int)uVar17);
                (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar8,0);
              }
            }
          }
        }
        else {
          TVar7 = pOVar8->m_type;
          uVar4 = TVar7 - outer;
          if (uVar4 < 2) {
            local_60 = pOVar9;
            local_40 = (ulong)TVar7;
            local_58 = NewLoop(this,TVar7);
            pOVar8 = Loop(this,loop_index);
            uVar17 = uVar5;
            if ((uint)iVar6 >= uVar5 && iVar6 != uVar5) {
              uVar17 = iVar6;
            }
            if ((uint)iVar6 < uVar5) {
              uVar5 = iVar6;
            }
            uVar19 = (ulong)uVar5;
            pOVar10 = ON_BrepLoop::Trim(pOVar8,uVar5);
            local_50 = ON_BrepLoop::Trim(pOVar8,uVar17);
            pOVar10->m_li = -1;
            local_50->m_li = -1;
            piVar11 = (pOVar8->m_ti).m_a;
            piVar11[uVar19] = -1;
            piVar11[uVar17] = -1;
            pOVar21 = &local_58->m_ti;
            x = &local_58->m_loop_index;
            lVar22 = uVar19 * 4;
            uVar20 = uVar19;
            local_48 = pOVar10;
            while( true ) {
              this_00 = local_58;
              lVar22 = lVar22 + 4;
              uVar20 = uVar20 + 1;
              if ((int)uVar17 <= (int)uVar20) break;
              pOVar10 = ON_BrepLoop::Trim(pOVar8,(int)uVar20);
              ON_SimpleArray<int>::Append(pOVar21,(int *)((long)(pOVar8->m_ti).m_a + lVar22));
              pOVar10->m_li = *x;
              piVar11 = (pOVar8->m_ti).m_a;
              piVar11[uVar20] = -1;
            }
            uVar17 = uVar17 + 1;
            piVar15 = piVar11 + uVar17;
            for (uVar18 = uVar17; (int)uVar18 < iVar3; uVar18 = uVar18 + 1) {
              piVar11[uVar19] = *piVar15;
              uVar19 = uVar19 + 1;
              piVar15 = piVar15 + 1;
            }
            if ((int)uVar19 <= (pOVar8->m_ti).m_capacity) {
              (pOVar8->m_ti).m_count = (int)uVar19;
            }
            local_58->m_fi = pOVar8->m_fi;
            pOVar10 = ON_BrepLoop::Trim(local_58,0);
            iVar6 = ON_BrepLoop::TrimCount(this_00);
            pOVar12 = ON_BrepLoop::Trim(this_00,iVar6 + -1);
            MatchTrimEnds(this,pOVar12,pOVar10);
            iVar6 = ON_BrepLoop::TrimCount(pOVar8);
            pOVar10 = ON_BrepLoop::Trim(pOVar8,(int)(iVar6 + uVar5 + -1) % iVar6);
            pOVar12 = ON_BrepLoop::Trim(pOVar8,(int)uVar17 % iVar6);
            MatchTrimEnds(this,pOVar10,pOVar12);
            DeleteTrim(this,local_48,true);
            DeleteTrim(this,local_50,true);
            TVar7 = ComputeLoopType(this,pOVar8);
            pOVar8->m_type = TVar7;
            TVar7 = ComputeLoopType(this,this_00);
            this_00->m_type = TVar7;
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar8,0);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,this_00,0);
            TVar7 = pOVar8->m_type;
            TVar14 = (TYPE)local_40;
            if (TVar7 == TVar14) {
              if (this_00->m_type == outer) {
                pOVar9 = NewFace(this,local_60->m_si);
                ON_SimpleArray<int>::Append(&pOVar9->m_li,x);
                this_00->m_fi = pOVar9->m_face_index;
              }
              else {
                if (this_00->m_type != inner) goto LAB_0043d459;
                this_00->m_fi = pOVar8->m_fi;
                ON_SimpleArray<int>::Append(&local_60->m_li,x);
              }
LAB_0043d54d:
              bVar2 = uVar4 < 2;
              if (uVar4 < 2) {
                RemoveSlits(this,this_00);
                bVar2 = true;
              }
            }
            else {
LAB_0043d459:
              if (TVar14 == outer) {
                bVar2 = false;
                if ((TVar7 == inner) && (this_00->m_type == outer)) {
                  this_00->m_fi = pOVar8->m_fi;
                  ON_SimpleArray<int>::Insert(&local_60->m_li,0,x);
                  goto LAB_0043d54d;
                }
              }
              else {
                if (TVar14 != inner) goto LAB_0043d4bf;
                bVar2 = false;
                if ((TVar7 == outer) && (this_00->m_type == inner)) {
                  this_00->m_fi = pOVar8->m_fi;
                  pOVar21 = &local_60->m_li;
                  ON_SimpleArray<int>::Append(pOVar21,x);
                  pOVar9 = local_60;
                  lVar22 = 0;
                  while( true ) {
                    iVar6 = ON_BrepFace::LoopCount(pOVar9);
                    if (iVar6 <= lVar22) break;
                    if ((pOVar9->m_li).m_a[lVar22] == pOVar8->m_loop_index) {
                      ON_SimpleArray<int>::Remove(pOVar21,(int)lVar22);
                      break;
                    }
                    lVar22 = lVar22 + 1;
                  }
                  pOVar9 = NewFace(this,pOVar9->m_si);
                  ON_SimpleArray<int>::Append(&pOVar9->m_li,&pOVar8->m_loop_index);
                  pOVar8->m_fi = pOVar9->m_face_index;
                  goto LAB_0043d54d;
                }
              }
            }
          }
          else {
LAB_0043d4bf:
            bVar2 = false;
          }
        }
      }
    }
    uVar16 = CONCAT71((int7)((ulong)local_38 >> 8),(byte)local_38 | bVar2);
  }
  pOVar8 = Loop(this,loop_index);
  if (pOVar8 != (ON_BrepLoop *)0x0) {
    pOVar8 = Loop(this,loop_index);
    if ((pOVar8->m_ti).m_count == 0) {
      pOVar8 = Loop(this,loop_index);
      DeleteLoop(this,pOVar8,true);
    }
  }
  return (bool)((byte)uVar16 & 1);
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepLoop& L)

{
  bool rc = false;
  bool rval = true;
  const int li = L.m_loop_index;

  int lti0, lti1;
  while (rval && FoundSlitPair(*Loop(li), &lti0, &lti1)){ 
    ON_BrepLoop* newloop = nullptr;
		// Warning- This can add a loop and or face causing
		//  reallocation of arrays so refernces (like L) are
		//  no longer valid.
    rval = RemoveSlitPair(*this, li, lti0, lti1, newloop);
    rc = rc || rval;
    if(rval && newloop)
      RemoveSlits(*newloop);
  }

	// 22-Oct-2009 Crash Fix TRR#55897
  if (Loop(li) && Loop(li)->m_ti.Count() == 0) 
    DeleteLoop(*Loop(li), true);
  
  return rc;
}